

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleFunctionArgument
          (HlslParseContext *this,TFunction *function,TIntermTyped **arguments,TIntermTyped *newArg)

{
  int iVar1;
  TType *this_00;
  undefined4 extraout_var;
  TIntermAggregate *pTVar2;
  undefined8 local_40;
  TParameter param;
  TIntermTyped *newArg_local;
  TIntermTyped **arguments_local;
  TFunction *function_local;
  HlslParseContext *this_local;
  
  local_40 = 0;
  param.defaultValue = newArg;
  this_00 = (TType *)TType::operator_new((TType *)0x98,(size_t)function);
  TType::TType(this_00,EbtVoid,EvqTemporary,1,0,0,false);
  param.type = (TType *)0x0;
  param.name = (TString *)this_00;
  iVar1 = (*((param.defaultValue)->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  TType::shallowCopy(this_00,(TType *)CONCAT44(extraout_var,iVar1));
  (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function,&local_40);
  if (*arguments == (TIntermTyped *)0x0) {
    *arguments = param.defaultValue;
  }
  else {
    pTVar2 = TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        &(*arguments)->super_TIntermNode,&(param.defaultValue)->super_TIntermNode);
    *arguments = (TIntermTyped *)pTVar2;
  }
  return;
}

Assistant:

void HlslParseContext::handleFunctionArgument(TFunction* function,
                                              TIntermTyped*& arguments, TIntermTyped* newArg)
{
    TParameter param = { nullptr, new TType, nullptr };
    param.type->shallowCopy(newArg->getType());

    function->addParameter(param);
    if (arguments)
        arguments = intermediate.growAggregate(arguments, newArg);
    else
        arguments = newArg;
}